

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

int PHF::init<unsigned_int,false>(phf *phf,uint *k,size_t n,size_t l,size_t a,phf_seed_t seed)

{
  uint32_t uVar1;
  uint32_t uVar2;
  size_t __nmemb;
  size_t m_00;
  phf_key<unsigned_int> *__base;
  ulong uVar3;
  phf_bits_t *set;
  uint32_t *puVar4;
  phf_key<unsigned_int> *ppVar5;
  int *piVar6;
  bool bVar7;
  ulong local_128;
  ulong local_108;
  size_t local_100;
  ulong local_f8;
  ulong local_f0;
  size_t local_e8;
  ulong uStack_d8;
  uint32_t f;
  size_t d;
  phf_key<unsigned_int> *Bi_pe;
  phf_key<unsigned_int> *Bi_p;
  ulong uStack_b8;
  phf_hash_t g_1;
  size_t i;
  int error;
  uint32_t d_max;
  uint32_t *g;
  size_t T_n;
  phf_bits_t *T_b;
  phf_bits_t *T;
  phf_key<unsigned_int> *B_pe;
  phf_key<unsigned_int> *B_p;
  size_t *B_z;
  phf_key<unsigned_int> *B_k;
  size_t m;
  size_t r;
  size_t a1;
  size_t l1;
  size_t n1;
  phf_seed_t seed_local;
  size_t a_local;
  size_t l_local;
  size_t n_local;
  uint *k_local;
  phf *phf_local;
  
  local_e8 = n;
  if (n < 2) {
    local_e8 = 1;
  }
  local_f0 = l;
  if (l < 2) {
    local_f0 = 1;
  }
  local_f8 = a;
  if (99 < a) {
    local_f8 = 100;
  }
  if (local_f8 < 2) {
    local_108 = 1;
  }
  else {
    local_100 = a;
    if (99 < a) {
      local_100 = 100;
    }
    local_108 = local_100;
  }
  B_p = (phf_key<unsigned_int> *)0x0;
  T_b = (phf_bits_t *)0x0;
  i._4_4_ = 0;
  phf->nodiv = false;
  __nmemb = phf_primeup((local_e8 + (local_f0 - 1)) / local_f0);
  m_00 = phf_primeup((local_e8 * 100) / local_108);
  if ((__nmemb == 0) || (m_00 == 0)) {
    return 0x22;
  }
  __base = (phf_key<unsigned_int> *)calloc(local_e8,0x10);
  if ((__base != (phf_key<unsigned_int> *)0x0) &&
     (B_p = (phf_key<unsigned_int> *)calloc(__nmemb,8), B_p != (phf_key<unsigned_int> *)0x0)) {
    for (uStack_b8 = 0; uStack_b8 < n; uStack_b8 = uStack_b8 + 1) {
      uVar1 = phf_g_mod_r<false,unsigned_int>(k[uStack_b8],seed,__nmemb);
      __base[uStack_b8].k = k[uStack_b8];
      __base[uStack_b8].g = uVar1;
      __base[uStack_b8].n = (size_t *)(&B_p->k + (ulong)uVar1 * 2);
      *__base[uStack_b8].n = *__base[uStack_b8].n + 1;
    }
    qsort(__base,local_e8,0x10,phf_keycmp<unsigned_int>);
    uVar3 = m_00 + 0x3f >> 6;
    T_b = (phf_bits_t *)calloc(uVar3 << 1,8);
    if (T_b != (phf_bits_t *)0x0) {
      set = T_b + uVar3;
      puVar4 = (uint32_t *)calloc(__nmemb,4);
      if (puVar4 != (uint32_t *)0x0) {
        B_pe = __base;
        while( true ) {
          bVar7 = false;
          if (B_pe < __base + n) {
            bVar7 = *B_pe->n != 0;
          }
          if (!bVar7) break;
          uStack_d8 = 0;
LAB_0024f98e:
          local_128 = uStack_d8 + 1;
          Bi_pe = B_pe;
          ppVar5 = B_pe + *B_pe->n;
          for (; uVar1 = (uint32_t)local_128, Bi_pe < ppVar5; Bi_pe = Bi_pe + 1) {
            uVar2 = phf_f_mod_m<false,unsigned_int>(uVar1,Bi_pe->k,seed,m_00);
            bVar7 = phf_isset(T_b,(ulong)uVar2);
            if ((bVar7) || (bVar7 = phf_isset(set,(ulong)uVar2), bVar7)) goto LAB_0024fa32;
            phf_setbit(set,(ulong)uVar2);
          }
          for (Bi_pe = B_pe; Bi_pe < ppVar5; Bi_pe = Bi_pe + 1) {
            uVar2 = phf_f_mod_m<false,unsigned_int>(uVar1,Bi_pe->k,seed,m_00);
            phf_setbit(T_b,(ulong)uVar2);
          }
          puVar4[B_pe->g] = uVar1;
          if (local_128 <= i._4_4_) {
            local_128 = (ulong)i._4_4_;
          }
          i._4_4_ = (uint)local_128;
          B_pe = B_pe + *B_pe->n;
        }
        phf->seed = seed;
        phf->r = __nmemb;
        phf->m = m_00;
        phf->g = puVar4;
        phf->d_max = (ulong)i._4_4_;
        phf->g_op = PHF_G_UINT32_MOD_R;
        phf->g_jmp = (void *)0x0;
        i._0_4_ = 0;
        goto LAB_0024fc20;
      }
    }
  }
  piVar6 = __errno_location();
  i._0_4_ = *piVar6;
LAB_0024fc20:
  free((void *)0x0);
  free(T_b);
  free(B_p);
  free(__base);
  return (int)i;
LAB_0024fa32:
  for (Bi_pe = B_pe; uStack_d8 = local_128, Bi_pe < ppVar5; Bi_pe = Bi_pe + 1) {
    uVar2 = phf_f_mod_m<false,unsigned_int>(uVar1,Bi_pe->k,seed,m_00);
    phf_clrbit(set,(ulong)uVar2);
  }
  goto LAB_0024f98e;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}